

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStep_SetCoupling(ARKodeMem ark_mem)

{
  MRIStepCoupling pMVar1;
  ARKodeMem in_RDI;
  ARKODE_MRITableID table_id;
  int q_actual;
  sunindextype Clrw;
  sunindextype Cliw;
  ARKodeMRIStepMem step_mem;
  ARKODE_MRITableID in_stack_0000009c;
  int local_2c;
  long local_28;
  long local_20;
  void *local_18;
  ARKodeMem local_10;
  int local_4;
  
  if (in_RDI->step_mem == (void *)0x0) {
    arkProcessError(in_RDI,-0x15,0x6c8,"mriStep_SetCoupling",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                    ,"Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    local_18 = in_RDI->step_mem;
    local_2c = *(int *)((long)local_18 + 0x40);
    if (*(long *)((long)local_18 + 0x38) == 0) {
      local_10 = in_RDI;
      if ((local_2c < 1) || (4 < local_2c)) {
        arkProcessError(in_RDI,-0x16,0x6d4,"mriStep_SetCoupling",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                        ,"No MRI method at requested order, using q=3.");
        local_2c = 3;
      }
      if ((*(int *)((long)local_18 + 0x1c) == 0) || (*(int *)((long)local_18 + 0x18) == 0)) {
        if (*(int *)((long)local_18 + 0x1c) == 0) {
          switch(local_2c) {
          case 1:
            break;
          case 2:
            break;
          case 3:
            break;
          case 4:
          }
        }
        else {
          switch(local_2c) {
          case 1:
            break;
          case 2:
            break;
          case 3:
            break;
          case 4:
          }
        }
      }
      else {
        switch(local_2c) {
        case 1:
          break;
        case 2:
          break;
        case 3:
          break;
        case 4:
        }
      }
      pMVar1 = MRIStepCoupling_LoadTable(in_stack_0000009c);
      *(MRIStepCoupling *)((long)local_18 + 0x38) = pMVar1;
      if (*(long *)((long)local_18 + 0x38) == 0) {
        arkProcessError(local_10,-0x29,0x702,"mriStep_SetCoupling",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                        ,"An error occurred in constructing coupling table.");
        local_4 = -0x29;
      }
      else {
        MRIStepCoupling_Space(*(MRIStepCoupling *)((long)local_18 + 0x38),&local_20,&local_28);
        local_10->liw = local_20 + local_10->liw;
        local_10->lrw = local_28 + local_10->lrw;
        *(undefined4 *)((long)local_18 + 0x48) =
             *(undefined4 *)(*(long *)((long)local_18 + 0x38) + 4);
        *(undefined4 *)((long)local_18 + 0x40) =
             *(undefined4 *)(*(long *)((long)local_18 + 0x38) + 8);
        *(undefined4 *)((long)local_18 + 0x44) =
             *(undefined4 *)(*(long *)((long)local_18 + 0x38) + 0xc);
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int mriStep_SetCoupling(ARKodeMem ark_mem)
{
  ARKodeMRIStepMem step_mem;
  sunindextype Cliw, Clrw;
  int q_actual;
  ARKODE_MRITableID table_id;

  /* access ARKodeMRIStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_MRISTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeMRIStepMem)ark_mem->step_mem;
  q_actual = step_mem->q;

  /* if coupling has already been specified, just return */
  if (step_mem->MRIC != NULL) { return (ARK_SUCCESS); }

  if (q_actual < 1 || q_actual > 4)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "No MRI method at requested order, using q=3.");
    q_actual = 3;
  }

  /* select method based on order and type */

  /**** ImEx methods ****/
  if (step_mem->implicit_rhs && step_mem->explicit_rhs)
  {
    switch (q_actual)
    {
    case 1: table_id = MRISTEP_DEFAULT_IMEX_SD_1; break;
    case 2: table_id = MRISTEP_DEFAULT_IMEX_SD_2; break;
    case 3: table_id = MRISTEP_DEFAULT_IMEX_SD_2; break;
    case 4: table_id = MRISTEP_DEFAULT_IMEX_SD_2; break;
    }

    /**** implicit methods ****/
  }
  else if (step_mem->implicit_rhs)
  {
    switch (q_actual)
    {
    case 1: table_id = MRISTEP_DEFAULT_IMPL_SD_1; break;
    case 2: table_id = MRISTEP_DEFAULT_IMPL_SD_2; break;
    case 3: table_id = MRISTEP_DEFAULT_IMPL_SD_3; break;
    case 4: table_id = MRISTEP_DEFAULT_IMPL_SD_4; break;
    }

    /**** explicit methods ****/
  }
  else
  {
    switch (q_actual)
    {
    case 1: table_id = MRISTEP_DEFAULT_EXPL_1; break;
    case 2: table_id = MRISTEP_DEFAULT_EXPL_2; break;
    case 3: table_id = MRISTEP_DEFAULT_EXPL_3; break;
    case 4: table_id = MRISTEP_DEFAULT_EXPL_4; break;
    }
  }

  step_mem->MRIC = MRIStepCoupling_LoadTable(table_id);
  if (step_mem->MRIC == NULL)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "An error occurred in constructing coupling table.");
    return (ARK_INVALID_TABLE);
  }

  /* note coupling structure space requirements */
  MRIStepCoupling_Space(step_mem->MRIC, &Cliw, &Clrw);
  ark_mem->liw += Cliw;
  ark_mem->lrw += Clrw;

  /* set [redundant] stored values for stage numbers and
     method/embedding orders */
  step_mem->stages = step_mem->MRIC->stages;
  step_mem->q      = step_mem->MRIC->q;
  step_mem->p      = step_mem->MRIC->p;

  return (ARK_SUCCESS);
}